

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__filename;
  FILE *__stream;
  FILE *__stream_00;
  int iVar1;
  
  if (1 < argc) {
    iVar1 = 1;
    do {
      __filename = argv[iVar1];
      if (*__filename != '-') {
        __stream = fopen(__filename,"r");
        if (__stream == (FILE *)0x0) {
LAB_00102bfd:
          main_cold_3();
        }
        else {
          __stream_00 = fopen(argv[(long)iVar1 + 2],"w");
          if (__stream_00 != (FILE *)0x0) {
            model_ = (model *)load_model(argv[(long)iVar1 + 1]);
            if (model_ != (model *)0x0) {
              x = (feature_node *)malloc((long)max_nr_attr << 4);
              do_predict((FILE *)__stream,(FILE *)__stream_00);
              free_and_destroy_model(&model_);
              free(line);
              free(x);
              fclose(__stream);
              fclose(__stream_00);
              return 0;
            }
            goto LAB_00102c11;
          }
        }
        main_cold_2();
LAB_00102c11:
        main_cold_1();
        halt_baddata();
      }
      if (__filename[1] == 'q') {
        info = print_null;
      }
      else {
        if (__filename[1] != 'b') {
          main_cold_4();
          goto LAB_00102bfd;
        }
        flag_predict_probability = atoi(argv[(long)iVar1 + 1]);
        iVar1 = iVar1 + 1;
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 < argc);
  }
  puts(
      "Usage: predict [options] test_file model_file output_file\noptions:\n-b probability_estimates: whether to output probability estimates, 0 or 1 (default 0); currently for logistic regression only\n-q : quiet mode (no outputs)"
      );
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	FILE *input, *output;
	int i;

	// parse options
	for(i=1;i<argc;i++)
	{
		if(argv[i][0] != '-') break;
		++i;
		switch(argv[i-1][1])
		{
			case 'b':
				flag_predict_probability = atoi(argv[i]);
				break;
			case 'q':
				info = &print_null;
				i--;
				break;
			default:
				fprintf(stderr,"unknown option: -%c\n", argv[i-1][1]);
				exit_with_help();
				break;
		}
	}
	if(i>=argc)
		exit_with_help();

	input = fopen(argv[i],"r");
	if(input == NULL)
	{
		fprintf(stderr,"can't open input file %s\n",argv[i]);
		exit(1);
	}

	output = fopen(argv[i+2],"w");
	if(output == NULL)
	{
		fprintf(stderr,"can't open output file %s\n",argv[i+2]);
		exit(1);
	}

	if((model_=load_model(argv[i+1]))==0)
	{
		fprintf(stderr,"can't open model file %s\n",argv[i+1]);
		exit(1);
	}

	x = (struct feature_node *) malloc(max_nr_attr*sizeof(struct feature_node));
	do_predict(input, output);
	free_and_destroy_model(&model_);
	free(line);
	free(x);
	fclose(input);
	fclose(output);
	return 0;
}